

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O2

void master_table_create_dictionary
               (planck_unit_test_t *tc,MasterTable *master_table,Dictionary<int,_int> *dictionary,
               ion_dictionary_id_t id,ion_key_type_t key_type,ion_key_size_t key_size,
               ion_value_size_t value_size,ion_dictionary_size_t dictionary_size,
               ion_dictionary_type_t dictionary_type)

{
  planck_unit_result_t pVar1;
  MasterTable *master_table_00;
  ion_dictionary_config_info_t config;
  
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,0,(int)(dictionary->dict).status,0xaf,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar1 != '\0') {
    pVar1 = planck_unit_assert_int_are_equal
                      (tc,id,((dictionary->dict).instance)->id,0xb0,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                      );
    if (pVar1 != '\0') {
      pVar1 = planck_unit_assert_int_are_equal
                        (tc,key_type,((dictionary->dict).instance)->key_type,0xb1,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                        );
      if (pVar1 != '\0') {
        pVar1 = planck_unit_assert_int_are_equal
                          (tc,key_size,(((dictionary->dict).instance)->record).key_size,0xb2,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                          );
        if (pVar1 != '\0') {
          pVar1 = planck_unit_assert_int_are_equal
                            (tc,value_size,(((dictionary->dict).instance)->record).value_size,0xb3,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                            );
          if (pVar1 != '\0') {
            pVar1 = planck_unit_assert_int_are_equal
                              (tc,dictionary_size,dictionary->dict_size,0xb4,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                              );
            if (pVar1 != '\0') {
              master_table_00 = (MasterTable *)(ulong)dictionary_type;
              pVar1 = planck_unit_assert_int_are_equal
                                (tc,dictionary_type,((dictionary->dict).instance)->type,0xb5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                                );
              if (pVar1 != '\0') {
                master_table_lookup_dictionary
                          (tc,master_table_00,id,key_type,key_size,value_size,dictionary_size,
                           dictionary_type,&config,'\x01');
                return;
              }
            }
          }
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
master_table_create_dictionary(
	planck_unit_test_t *tc,
	MasterTable *master_table,
	Dictionary<int, int>	*dictionary,
	ion_dictionary_id_t id,
	ion_key_type_t key_type,
	ion_key_size_t key_size,
	ion_value_size_t value_size,
	ion_dictionary_size_t dictionary_size,
	ion_dictionary_type_t dictionary_type
) {
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, id, dictionary->dict.instance->id);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, key_type, dictionary->dict.instance->key_type);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, key_size, dictionary->dict.instance->record.key_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, value_size, dictionary->dict.instance->record.value_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dictionary_size, dictionary->dict_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dictionary_type, dictionary->dict.instance->type);

	ion_dictionary_config_info_t config;

	master_table_lookup_dictionary(tc, master_table, id, key_type, key_size, value_size, dictionary_size, dictionary_type, &config, boolean_true);
}